

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

StyleProp * CreateProps(TidyDocImpl *doc,StyleProp *prop,ctmbstr style)

{
  tmbstr ptVar1;
  bool bVar2;
  Bool more;
  tmbstr line;
  tmbstr value_end;
  tmbstr name_end;
  tmbstr value;
  tmbstr name;
  ctmbstr style_local;
  StyleProp *prop_local;
  TidyDocImpl *doc_local;
  
  name_end = (tmbstr)0x0;
  ptVar1 = prvTidytmbstrdup(doc->allocator,style);
  value = ptVar1;
  style_local = (ctmbstr)prop;
  while (*value != '\0') {
    for (; *value == ' '; value = value + 1) {
    }
    for (value_end = value; *value_end != '\0'; value_end = value_end + 1) {
      if (*value_end == ':') {
        name_end = value_end + 1;
        break;
      }
    }
    if (*value_end != ':') break;
    while( true ) {
      bVar2 = false;
      if (name_end != (tmbstr)0x0) {
        bVar2 = *name_end == ' ';
      }
      if (!bVar2) break;
      name_end = name_end + 1;
    }
    bVar2 = false;
    for (line = name_end; *line != '\0'; line = line + 1) {
      if (*line == ';') {
        bVar2 = true;
        break;
      }
    }
    *value_end = '\0';
    *line = '\0';
    style_local = (ctmbstr)InsertProperty(doc,(StyleProp *)style_local,value,name_end);
    *value_end = ':';
    if (!bVar2) break;
    *line = ';';
    value = line + 1;
  }
  (*doc->allocator->vtbl->free)(doc->allocator,ptVar1);
  return (StyleProp *)style_local;
}

Assistant:

static StyleProp* CreateProps( TidyDocImpl* doc, StyleProp* prop, ctmbstr style )
{
    tmbstr name, value = NULL, name_end, value_end, line;
    Bool more;

    line = TY_(tmbstrdup)(doc->allocator, style);
    name = line;

    while (*name)
    {
        while (*name == ' ')
            ++name;

        name_end = name;

        while (*name_end)
        {
            if (*name_end == ':')
            {
                value = name_end + 1;
                break;
            }

            ++name_end;
        }

        if (*name_end != ':')
            break;

        while ( value && *value == ' ')
            ++value;

        value_end = value;
        more = no;

        while (*value_end)
        {
            if (*value_end == ';')
            {
                more = yes;
                break;
            }

            ++value_end;
        }

        *name_end = '\0';
        *value_end = '\0';

        prop = InsertProperty(doc, prop, name, value);
        *name_end = ':';

        if (more)
        {
            *value_end = ';';
            name = value_end + 1;
            continue;
        }

        break;
    }

    TidyDocFree(doc, line);  /* free temporary copy */
    return prop;
}